

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int isofile_gen_utility_names(archive_write *a,isofile *file)

{
  long lVar1;
  ulong uVar2;
  wchar_t wVar3;
  mode_t mVar4;
  char *pcVar5;
  archive_string_conv *paVar6;
  int *piVar7;
  archive_string *paVar8;
  size_t sVar9;
  long in_RSI;
  archive *in_RDI;
  char *rp;
  size_t ll;
  size_t ulen_last;
  size_t u16len;
  char *ulast;
  char *u16;
  int ret;
  size_t len;
  char *slash;
  char *dirname;
  char *p;
  char *pathname;
  iso9660_conflict *iso9660;
  archive_entry *in_stack_ffffffffffffff38;
  archive_string *in_stack_ffffffffffffff40;
  archive_string *in_stack_ffffffffffffff48;
  archive_entry *in_stack_ffffffffffffff50;
  void *in_stack_ffffffffffffff58;
  archive_string *in_stack_ffffffffffffff60;
  char *local_80;
  ulong local_70;
  ulong local_68;
  char *local_60;
  char *local_58;
  int local_4c;
  ulong local_48;
  char *local_40;
  char *local_30;
  
  local_4c = 0;
  lVar1 = *(long *)&in_RDI[1].current_codepage;
  *(undefined8 *)(in_RSI + 0x30) = 0;
  *(undefined8 *)(in_RSI + 0x48) = 0;
  *(undefined8 *)(in_RSI + 0x60) = 0;
  *(undefined8 *)(in_RSI + 0x78) = 0;
  pcVar5 = archive_entry_pathname(in_stack_ffffffffffffff38);
  if ((pcVar5 == (char *)0x0) || (*pcVar5 == '\0')) {
    *(undefined4 *)(in_RSI + 0x88) = 0;
    return 0;
  }
  if ((*(uint *)(lVar1 + 0x10370) >> 0x11 & 3) != 0) {
    if (*(long *)(lVar1 + 0x78) == 0) {
      paVar6 = archive_string_conversion_to_charset
                         ((archive_conflict *)in_stack_ffffffffffffff50,
                          (char *)in_stack_ffffffffffffff48,
                          (wchar_t)((ulong)in_stack_ffffffffffffff40 >> 0x20));
      *(archive_string_conv **)(lVar1 + 0x78) = paVar6;
      if (*(long *)(lVar1 + 0x78) == 0) {
        return -0x1e;
      }
      paVar6 = archive_string_conversion_from_charset
                         ((archive_conflict *)in_stack_ffffffffffffff50,
                          (char *)in_stack_ffffffffffffff48,
                          (wchar_t)((ulong)in_stack_ffffffffffffff40 >> 0x20));
      *(archive_string_conv **)(lVar1 + 0x80) = paVar6;
      if (*(long *)(lVar1 + 0x80) == 0) {
        return -0x1e;
      }
    }
    wVar3 = _archive_entry_pathname_l
                      (in_stack_ffffffffffffff50,&in_stack_ffffffffffffff48->s,
                       (size_t *)in_stack_ffffffffffffff40,
                       (archive_string_conv *)in_stack_ffffffffffffff38);
    if (wVar3 < L'\0') {
      piVar7 = __errno_location();
      if (*piVar7 == 0xc) {
        archive_set_error(in_RDI,0xc,"Can\'t allocate memory for UTF-16BE");
        return -0x1e;
      }
      archive_set_error(in_RDI,-1,
                        "A filename cannot be converted to UTF-16BE;You should disable making Joliet extension"
                       );
      local_4c = -0x14;
    }
    for (; ((1 < local_68 && (local_58[local_68 - 2] == '\0')) && (local_58[local_68 - 1] == '/'));
        local_68 = local_68 - 2) {
    }
    local_60 = local_58;
    local_70 = local_68 >> 1;
    for (local_68 = local_70; local_68 != 0; local_68 = local_68 - 1) {
      if ((*local_58 == '\0') && (local_58[1] == '/')) {
        local_60 = local_58 + 2;
        local_70 = local_68 - 1;
      }
      local_58 = local_58 + 2;
    }
    paVar8 = archive_string_ensure(in_stack_ffffffffffffff48,(size_t)in_stack_ffffffffffffff40);
    if (paVar8 == (archive_string *)0x0) {
      archive_set_error(in_RDI,0xc,"Can\'t allocate memory for UTF-16BE");
      return -0x1e;
    }
    memcpy(*(void **)(in_RSI + 0x58),local_60,local_70 << 1);
    *(ulong *)(in_RSI + 0x60) = local_70 << 1;
  }
  *(undefined8 *)(in_RSI + 0x30) = 0;
  if (pcVar5 != (char *)0x0) {
    strlen(pcVar5);
  }
  archive_strncat(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                  (size_t)in_stack_ffffffffffffff50);
  local_48 = *(ulong *)(in_RSI + 0x30);
  pcVar5 = *(char **)(in_RSI + 0x28);
  local_30 = pcVar5;
  while (*local_30 != '\0') {
    if (*local_30 == '/') {
      local_30 = local_30 + 1;
      local_48 = local_48 - 1;
    }
    else {
      if (*local_30 != '.') break;
      if ((local_30[1] == '.') && (local_30[2] == '/')) {
        local_30 = local_30 + 3;
        local_48 = local_48 - 3;
      }
      else if ((local_30[1] == '/') || ((local_30[1] == '.' && (local_30[2] == '\0')))) {
        local_30 = local_30 + 2;
        local_48 = local_48 - 2;
      }
      else {
        if (local_30[1] != '\0') break;
        local_30 = local_30 + 1;
        local_48 = local_48 - 1;
      }
    }
  }
  if (local_30 != pcVar5) {
    memmove(pcVar5,local_30,local_48 + 1);
    local_30 = pcVar5;
  }
  do {
    uVar2 = local_48;
    if (local_48 == 0) break;
    if ((local_48 != 0) && (local_30[local_48 - 1] == '/')) {
      local_30[local_48 - 1] = '\0';
      local_48 = local_48 - 1;
    }
    if (((1 < local_48) && (local_30[local_48 - 2] == '/')) && (local_30[local_48 - 1] == '.')) {
      local_30[local_48 - 2] = '\0';
      local_48 = local_48 - 2;
    }
    if (((2 < local_48) && (local_30[local_48 - 3] == '/')) &&
       ((local_30[local_48 - 2] == '.' && (local_30[local_48 - 1] == '.')))) {
      local_30[local_48 - 3] = '\0';
      local_48 = local_48 - 3;
    }
  } while (uVar2 != local_48);
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            if (*local_30 == '\0') {
              sVar9 = strlen(pcVar5);
              mVar4 = archive_entry_filetype(*(archive_entry **)(in_RSI + 0x20));
              if (mVar4 == 0xa000) {
                in_stack_ffffffffffffff60 =
                     (archive_string *)archive_entry_symlink(in_stack_ffffffffffffff38);
                *(undefined8 *)(in_RSI + 0x78) = 0;
                in_stack_ffffffffffffff58 = (void *)(in_RSI + 0x70);
                if (in_stack_ffffffffffffff60 == (archive_string *)0x0) {
                  in_stack_ffffffffffffff50 = (archive_entry *)0x0;
                }
                else {
                  in_stack_ffffffffffffff50 =
                       (archive_entry *)strlen((char *)in_stack_ffffffffffffff60);
                }
                archive_strncat(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                                (size_t)in_stack_ffffffffffffff50);
              }
              local_40 = (char *)0x0;
              *(undefined4 *)(in_RSI + 0x88) = 0;
              for (local_30 = pcVar5; *local_30 != '\0'; local_30 = local_30 + 1) {
                if (*local_30 == '/') {
                  local_40 = local_30;
                  *(int *)(in_RSI + 0x88) = *(int *)(in_RSI + 0x88) + 1;
                }
              }
              if (local_40 == (char *)0x0) {
                *(size_t *)(in_RSI + 0x30) = sVar9;
                *(undefined8 *)(in_RSI + 0x48) = 0;
                archive_string_concat
                          (in_stack_ffffffffffffff40,(archive_string *)in_stack_ffffffffffffff38);
                *(undefined8 *)(in_RSI + 0x30) = 0;
                **(undefined1 **)(in_RSI + 0x28) = 0;
              }
              else {
                *local_40 = '\0';
                *(long *)(in_RSI + 0x30) = (long)local_40 - (long)pcVar5;
                *(undefined8 *)(in_RSI + 0x48) = 0;
                if (local_40 != (char *)0xffffffffffffffff) {
                  strlen(local_40 + 1);
                }
                archive_strncat(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                                (size_t)in_stack_ffffffffffffff50);
                mVar4 = archive_entry_filetype(*(archive_entry **)(in_RSI + 0x20));
                if (mVar4 == 0x4000) {
                  *(int *)(in_RSI + 0x88) = *(int *)(in_RSI + 0x88) + 1;
                }
              }
              return local_4c;
            }
            if (*local_30 == '/') break;
            local_30 = local_30 + 1;
          }
          if (local_30[1] != '/') break;
          strcpy(local_30,local_30 + 1);
        }
        if ((local_30[1] != '.') || (local_30[2] != '/')) break;
        strcpy(local_30,local_30 + 2);
      }
      if ((local_30[1] == '.') &&
         ((local_30[2] == '.' && (local_80 = local_30, local_30[3] == '/')))) break;
      local_30 = local_30 + 1;
    }
    do {
      local_80 = local_80 + -1;
      if (local_80 < pcVar5) break;
    } while (*local_80 != '/');
    if (pcVar5 < local_80) {
      strcpy(local_80,local_30 + 3);
      local_30 = local_80;
    }
    else {
      strcpy(pcVar5,local_30 + 4);
      local_30 = pcVar5;
    }
  } while( true );
}

Assistant:

static int
isofile_gen_utility_names(struct archive_write *a, struct isofile *file)
{
	struct iso9660 *iso9660;
	const char *pathname;
	char *p, *dirname, *slash;
	size_t len;
	int ret = ARCHIVE_OK;

	iso9660 = a->format_data;

	archive_string_empty(&(file->parentdir));
	archive_string_empty(&(file->basename));
	archive_string_empty(&(file->basename_utf16));
	archive_string_empty(&(file->symlink));

	pathname =  archive_entry_pathname(file->entry);
	if (pathname == NULL || pathname[0] == '\0') {/* virtual root */
		file->dircnt = 0;
		return (ret);
	}

	/*
	 * Make a UTF-16BE basename if Joliet extension enabled.
	 */
	if (iso9660->opt.joliet) {
		const char *u16, *ulast;
		size_t u16len, ulen_last;

		if (iso9660->sconv_to_utf16be == NULL) {
			iso9660->sconv_to_utf16be =
			    archive_string_conversion_to_charset(
				&(a->archive), "UTF-16BE", 1);
			if (iso9660->sconv_to_utf16be == NULL)
				/* Couldn't allocate memory */
				return (ARCHIVE_FATAL);
			iso9660->sconv_from_utf16be =
			    archive_string_conversion_from_charset(
				&(a->archive), "UTF-16BE", 1);
			if (iso9660->sconv_from_utf16be == NULL)
				/* Couldn't allocate memory */
				return (ARCHIVE_FATAL);
		}

		/*
		 * Converte a filename to UTF-16BE.
		 */
		if (0 > archive_entry_pathname_l(file->entry, &u16, &u16len,
		    iso9660->sconv_to_utf16be)) {
			if (errno == ENOMEM) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory for UTF-16BE");
				return (ARCHIVE_FATAL);
			}
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "A filename cannot be converted to UTF-16BE;"
			    "You should disable making Joliet extension");
			ret = ARCHIVE_WARN;
		}

		/*
		 * Make sure a path separator is not in the last;
		 * Remove trailing '/'.
		 */
		while (u16len >= 2) {
#if defined(_WIN32) || defined(__CYGWIN__)
			if (u16[u16len-2] == 0 &&
			    (u16[u16len-1] == '/' || u16[u16len-1] == '\\'))
#else
			if (u16[u16len-2] == 0 && u16[u16len-1] == '/')
#endif
			{
				u16len -= 2;
			} else
				break;
		}

		/*
		 * Find a basename in UTF-16BE.
		 */
		ulast = u16;
		u16len >>= 1;
		ulen_last = u16len;
		while (u16len > 0) {
#if defined(_WIN32) || defined(__CYGWIN__)
			if (u16[0] == 0 && (u16[1] == '/' || u16[1] == '\\'))
#else
			if (u16[0] == 0 && u16[1] == '/')
#endif
			{
				ulast = u16 + 2;
				ulen_last = u16len -1;
			}
			u16 += 2;
			u16len --;
		}
		ulen_last <<= 1;
		if (archive_string_ensure(&(file->basename_utf16),
		    ulen_last) == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for UTF-16BE");
			return (ARCHIVE_FATAL);
		}

		/*
		 * Set UTF-16BE basename.
		 */
		memcpy(file->basename_utf16.s, ulast, ulen_last);
		file->basename_utf16.length = ulen_last;
	}

	archive_strcpy(&(file->parentdir), pathname);
#if defined(_WIN32) || defined(__CYGWIN__)
	/*
	 * Convert a path-separator from '\' to  '/'
	 */
	if (cleanup_backslash_1(file->parentdir.s) != 0) {
		const wchar_t *wp = archive_entry_pathname_w(file->entry);
		struct archive_wstring ws;

		if (wp != NULL) {
			int r;
			archive_string_init(&ws);
			archive_wstrcpy(&ws, wp);
			cleanup_backslash_2(ws.s);
			archive_string_empty(&(file->parentdir));
			r = archive_string_append_from_wcs(&(file->parentdir),
			    ws.s, ws.length);
			archive_wstring_free(&ws);
			if (r < 0 && errno == ENOMEM) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory");
				return (ARCHIVE_FATAL);
			}
		}
	}
#endif

	len = file->parentdir.length;
	p = dirname = file->parentdir.s;

	/*
	 * Remove leading '/', '../' and './' elements
	 */
	while (*p) {
		if (p[0] == '/') {
			p++;
			len--;
		} else if (p[0] != '.')
			break;
		else if (p[1] == '.' && p[2] == '/') {
			p += 3;
			len -= 3;
		} else if (p[1] == '/' || (p[1] == '.' && p[2] == '\0')) {
			p += 2;
			len -= 2;
		} else if (p[1] == '\0') {
			p++;
			len--;
		} else
			break;
	}
	if (p != dirname) {
		memmove(dirname, p, len+1);
		p = dirname;
	}
	/*
	 * Remove "/","/." and "/.." elements from tail.
	 */
	while (len > 0) {
		size_t ll = len;

		if (len > 0 && p[len-1] == '/') {
			p[len-1] = '\0';
			len--;
		}
		if (len > 1 && p[len-2] == '/' && p[len-1] == '.') {
			p[len-2] = '\0';
			len -= 2;
		}
		if (len > 2 && p[len-3] == '/' && p[len-2] == '.' &&
		    p[len-1] == '.') {
			p[len-3] = '\0';
			len -= 3;
		}
		if (ll == len)
			break;
	}
	while (*p) {
		if (p[0] == '/') {
			if (p[1] == '/')
				/* Convert '//' --> '/' */
				strcpy(p, p+1);
			else if (p[1] == '.' && p[2] == '/')
				/* Convert '/./' --> '/' */
				strcpy(p, p+2);
			else if (p[1] == '.' && p[2] == '.' && p[3] == '/') {
				/* Convert 'dir/dir1/../dir2/'
				 *     --> 'dir/dir2/'
				 */
				char *rp = p -1;
				while (rp >= dirname) {
					if (*rp == '/')
						break;
					--rp;
				}
				if (rp > dirname) {
					strcpy(rp, p+3);
					p = rp;
				} else {
					strcpy(dirname, p+4);
					p = dirname;
				}
			} else
				p++;
		} else
			p++;
	}
	p = dirname;
	len = strlen(p);

	if (archive_entry_filetype(file->entry) == AE_IFLNK) {
		/* Convert symlink name too. */
		pathname = archive_entry_symlink(file->entry);
		archive_strcpy(&(file->symlink),  pathname);
#if defined(_WIN32) || defined(__CYGWIN__)
		/*
		 * Convert a path-separator from '\' to  '/'
		 */
		if (archive_strlen(&(file->symlink)) > 0 &&
		    cleanup_backslash_1(file->symlink.s) != 0) {
			const wchar_t *wp =
			    archive_entry_symlink_w(file->entry);
			struct archive_wstring ws;

			if (wp != NULL) {
				int r;
				archive_string_init(&ws);
				archive_wstrcpy(&ws, wp);
				cleanup_backslash_2(ws.s);
				archive_string_empty(&(file->symlink));
				r = archive_string_append_from_wcs(
				    &(file->symlink),
				    ws.s, ws.length);
				archive_wstring_free(&ws);
				if (r < 0 && errno == ENOMEM) {
					archive_set_error(&a->archive, ENOMEM,
					    "Can't allocate memory");
					return (ARCHIVE_FATAL);
				}
			}
		}
#endif
	}
	/*
	 * - Count up directory elements.
	 * - Find out the position which points the last position of
	 *   path separator('/').
	 */
	slash = NULL;
	file->dircnt = 0;
	for (; *p != '\0'; p++)
		if (*p == '/') {
			slash = p;
			file->dircnt++;
		}
	if (slash == NULL) {
		/* The pathname doesn't have a parent directory. */
		file->parentdir.length = len;
		archive_string_copy(&(file->basename), &(file->parentdir));
		archive_string_empty(&(file->parentdir));
		*file->parentdir.s = '\0';
		return (ret);
	}

	/* Make a basename from dirname and slash */
	*slash  = '\0';
	file->parentdir.length = slash - dirname;
	archive_strcpy(&(file->basename),  slash + 1);
	if (archive_entry_filetype(file->entry) == AE_IFDIR)
		file->dircnt ++;
	return (ret);
}